

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::evalTexture1DArrayShadowGradOffset
               (ShaderEvalContext *c,TexLookupParams *p)

{
  float s;
  float t;
  uint uVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar5 = c->in[0].m_data[2];
  s = c->in[0].m_data[0];
  fVar3 = (float)(c->textures[0].tex1DArray)->m_width;
  t = c->in[0].m_data[1];
  fVar4 = fVar3 * c->in[1].m_data[0];
  fVar3 = fVar3 * c->in[2].m_data[0];
  uVar1 = -(uint)(-fVar4 <= fVar4);
  uVar2 = -(uint)(-fVar3 <= fVar3);
  fVar4 = (float)(~uVar1 & (uint)-fVar4 | (uint)fVar4 & uVar1);
  fVar3 = (float)(~uVar2 & (uint)-fVar3 | (uint)fVar3 & uVar2);
  uVar1 = -(uint)(fVar3 <= fVar4);
  fVar3 = logf((float)(~uVar1 & (uint)fVar3 | (uint)fVar4 & uVar1));
  fVar5 = tcu::Texture1DArrayView::sampleCompareOffset
                    (&(c->textures[0].tex1DArray)->m_view,&c->textures[0].sampler,fVar5,s,t,
                     fVar3 * 1.442695,(p->offset).m_data[0]);
  (c->color).m_data[0] = fVar5;
  return;
}

Assistant:

static void		evalTexture1DArrayShadowGradOffset	(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color.x() = texture1DArrayShadowOffset(c, c.in[0].z(), c.in[0].x(), c.in[0].y(), computeLodFromGrad1DArray(c), p.offset.x()); }